

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::PragmaInfo::Deserialize(PragmaInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  pointer pPVar2;
  pointer *__ptr;
  unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true> result;
  _Head_base<0UL,_duckdb::PragmaInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_58._M_head_impl = (PragmaInfo *)operator_new(0x80);
  ((local_58._M_head_impl)->super_ParseInfo).info_type = PRAGMA_INFO;
  ((local_58._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__PragmaInfo_02488378;
  ((local_58._M_head_impl)->name)._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->name).field_2;
  ((local_58._M_head_impl)->name)._M_string_length = 0;
  ((local_58._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58._M_head_impl)->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58._M_head_impl)->parameters).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_buckets =
       &((local_58._M_head_impl)->named_parameters)._M_h._M_single_bucket;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_bucket_count = 1;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_element_count = 0;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_58._M_head_impl)->named_parameters)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     ((unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>
                       *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pPVar2->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010bcbc4;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pPVar2->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010bcbc4;
  }
  operator_delete(local_50);
LAB_010bcbc4:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     ((unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xc9,"parameters",&pPVar2->parameters);
  pPVar2 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator->
                     ((unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>>>
            (deserializer,0xca,"named_parameters",&pPVar2->named_parameters);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> PragmaInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<PragmaInfo>(new PragmaInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(201, "parameters", result->parameters);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<unique_ptr<ParsedExpression>>>(202, "named_parameters", result->named_parameters);
	return std::move(result);
}